

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O2

BufferPtr __thiscall
Jinx::Impl::Runtime::Compile
          (Runtime *this,BufferPtr *scriptBuffer,String *name,
          initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
          libraries)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  char *start;
  bool bVar3;
  long lVar4;
  long lVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Runtime *this_00;
  Parser *this_01;
  size_type in_R9;
  BufferPtr BVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
  libraries_00;
  Lexer lexer;
  Parser parser;
  RuntimeIPtr local_2a50;
  undefined1 local_2a40 [104];
  Parser local_29d8;
  
  libraries_00._M_array = (iterator)libraries._M_len;
  lVar4 = std::chrono::_V2::system_clock::now();
  pcVar2 = (name->_M_dataplus)._M_p;
  start = *(char **)pcVar2;
  this_00 = (Runtime *)local_2a40;
  Lexer::Lexer((Lexer *)this_00,
               (SymbolTypeMap *)
               &scriptBuffer[0x11b].super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,start,start + *(long *)(pcVar2 + 8),libraries._M_array);
  bVar3 = Lexer::Execute((Lexer *)this_00);
  if (bVar3) {
    bVar3 = IsLogSymbolsEnabled();
    if (bVar3) {
      LogSymbols(this_00,(SymbolList *)(local_2a40 + 0x20));
    }
    std::__shared_ptr<Jinx::Impl::Runtime,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Jinx::Impl::Runtime,void>
              ((__shared_ptr<Jinx::Impl::Runtime,(__gnu_cxx::_Lock_policy)2> *)&local_2a50,
               (__weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2> *)
               &(scriptBuffer->super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
    libraries_00._M_len = in_R9;
    Parser::Parser(&local_29d8,&local_2a50,(SymbolList *)(local_2a40 + 0x20),libraries._M_array,
                   libraries_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_2a50.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    this_01 = &local_29d8;
    bVar3 = Parser::Execute(this_01);
    if (bVar3) {
      bVar3 = IsLogBytecodeEnabled();
      if (bVar3) {
        LogBytecode((Runtime *)this_01,&local_29d8);
      }
      lVar5 = std::chrono::_V2::system_clock::now();
      std::mutex::lock((mutex *)&((pthread_mutex_t *)(scriptBuffer + 0x115))->__data);
      scriptBuffer[0x119].super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           ((long)&(scriptBuffer[0x119].super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->m_data + 1);
      p_Var1 = &scriptBuffer[0x117].super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
      p_Var1->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)p_Var1->_M_pi + (lVar5 - lVar4));
      std::__shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2> *)this,
                 &local_29d8.m_bytecode.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>
                );
      pthread_mutex_unlock((pthread_mutex_t *)(scriptBuffer + 0x115));
    }
    else {
      (this->super_IRuntime)._vptr_IRuntime = (_func_int **)0x0;
      (this->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
      super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
      ;
    }
    Parser::~Parser(&local_29d8);
  }
  else {
    (this->super_IRuntime)._vptr_IRuntime = (_func_int **)0x0;
    (this->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
    super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  Lexer::~Lexer((Lexer *)local_2a40);
  BVar6.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  BVar6.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (BufferPtr)BVar6.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline_t BufferPtr Runtime::Compile(BufferPtr scriptBuffer, String name, std::initializer_list<String> libraries)
	{
		// Mark script execution start time
		auto begin = std::chrono::high_resolution_clock::now();

		// Lex script text into tokens
		Lexer lexer(m_symbolTypeMap, reinterpret_cast<const char *>(scriptBuffer->Ptr()), reinterpret_cast<const char *>(scriptBuffer->Ptr() + scriptBuffer->Size()), name);

		// Exit if errors when lexing
		if (!lexer.Execute())
			return nullptr;

		// Log all lexed symbols for development and debug purposes
		if (IsLogSymbolsEnabled())
			LogSymbols(lexer.GetSymbolList());

		// Create parser with symbol list
		Parser parser(shared_from_this(), lexer.GetSymbolList(), name, libraries);

		// Generate bytecode from symbol list
		if (!parser.Execute())
			return nullptr;

		// Log bytecode for development and debug purposes
		if (IsLogBytecodeEnabled())
			LogBytecode(parser);

		// Track accumulated script compilation time and count
		auto end = std::chrono::high_resolution_clock::now();
		uint64_t compilationTimeNs = std::chrono::duration_cast<std::chrono::nanoseconds>(end - begin).count();
		std::lock_guard<std::mutex> lock(m_perfMutex);
		m_perfStats.scriptCompilationCount++;
		m_perfStats.compilationTimeNs += compilationTimeNs;

		// Return the bytecode
		return parser.GetBytecode();
	}